

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::PlyParser::readBytes(PlyParser *this,void *dst,int num)

{
  runtime_error *this_00;
  ulong uVar1;
  long lVar2;
  bool bVar3;
  
  if (this->format == BINARY_LITTLE_ENDIAN) {
    std::istream::read((char *)this,(long)dst);
    return;
  }
  if (this->format != BINARY_BIG_ENDIAN) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"internal error on PLY loader");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar2 = (long)dst + (long)num;
  uVar1 = 0;
  if (0 < num) {
    uVar1 = (ulong)(uint)num;
  }
  while( true ) {
    lVar2 = lVar2 + -1;
    bVar3 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar3) break;
    std::istream::read((char *)this,lVar2);
  }
  return;
}

Assistant:

void readBytes(void* dst, int num) {
        if (format == BINARY_LITTLE_ENDIAN) fs.read((char*)dst,num);
        else if (format == BINARY_BIG_ENDIAN) for (int i=0; i<num; i++) fs.read((char*)dst+num-i-1,1);
        else throw std::runtime_error("internal error on PLY loader");
      }